

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_times.c
# Opt level: O1

void ngx_time_sigsafe_update(void)

{
  ngx_uint_t nVar1;
  u_char (*buf) [16];
  undefined1 local_88 [8];
  ngx_tm_t tm;
  timeval tv;
  
  if (ngx_time_lock != 0) {
    return;
  }
  LOCK();
  ngx_time_lock = 1;
  UNLOCK();
  gettimeofday((timeval *)&tm.tm_zone,(__timezone_ptr_t)0x0);
  if ((char *)cached_time[slot].sec != tm.tm_zone) {
    nVar1 = 0;
    if (slot != 0x3f) {
      nVar1 = slot + 1;
    }
    slot = nVar1;
    cached_time[nVar1].sec = 0;
    ngx_gmtime((time_t)(tm.tm_zone + cached_gmtoff * 0x3c),(ngx_tm_t *)local_88);
    ngx_sprintf(cached_err_log_time[nVar1],"%4d/%02d/%02d %02d:%02d:%02d",(ulong)(uint)tm.tm_mday,
                (ulong)(uint)tm.tm_hour,(ulong)(uint)tm.tm_min,(ulong)(uint)tm.tm_sec,
                (ulong)(uint)local_88._4_4_,(ulong)(uint)local_88._0_4_);
    buf = cached_syslog_time + slot;
    ngx_sprintf(*buf,"%s %2d %02d:%02d:%02d",*(undefined8 *)(&DAT_001b9ee8 + (long)tm.tm_hour * 8),
                (ulong)(uint)tm.tm_min,(ulong)(uint)tm.tm_sec,(ulong)(uint)local_88._4_4_,
                (ulong)(uint)local_88._0_4_);
    ngx_cached_err_log_time.data = cached_err_log_time[nVar1];
    ngx_cached_syslog_time.data = *buf;
  }
  ngx_time_lock = 0;
  return;
}

Assistant:

void
ngx_time_sigsafe_update(void)
{
    u_char          *p, *p2;
    ngx_tm_t         tm;
    time_t           sec;
    ngx_time_t      *tp;
    struct timeval   tv;

    if (!ngx_trylock(&ngx_time_lock)) {
        return;
    }

    ngx_gettimeofday(&tv);

    sec = tv.tv_sec;

    tp = &cached_time[slot];

    if (tp->sec == sec) {
        ngx_unlock(&ngx_time_lock);
        return;
    }

    if (slot == NGX_TIME_SLOTS - 1) {
        slot = 0;
    } else {
        slot++;
    }

    tp = &cached_time[slot];

    tp->sec = 0;

    ngx_gmtime(sec + cached_gmtoff * 60, &tm);

    p = &cached_err_log_time[slot][0];

    (void) ngx_sprintf(p, "%4d/%02d/%02d %02d:%02d:%02d",
                       tm.ngx_tm_year, tm.ngx_tm_mon,
                       tm.ngx_tm_mday, tm.ngx_tm_hour,
                       tm.ngx_tm_min, tm.ngx_tm_sec);

    p2 = &cached_syslog_time[slot][0];

    (void) ngx_sprintf(p2, "%s %2d %02d:%02d:%02d",
                       months[tm.ngx_tm_mon - 1], tm.ngx_tm_mday,
                       tm.ngx_tm_hour, tm.ngx_tm_min, tm.ngx_tm_sec);

    ngx_memory_barrier();

    ngx_cached_err_log_time.data = p;
    ngx_cached_syslog_time.data = p2;

    ngx_unlock(&ngx_time_lock);
}